

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepImage.cpp
# Opt level: O0

void testDeepImage(string *tempDir)

{
  ostream *poVar1;
  exception *e;
  string *in_stack_00000300;
  char *in_stack_ffffffffffffff80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  string local_58 [8];
  string *in_stack_ffffffffffffffb0;
  string local_38 [56];
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Testing class DeepImage");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::operator+(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  anon_unknown.dwarf_13b32::testScanLineImages(in_stack_ffffffffffffffb0);
  std::__cxx11::string::~string(local_38);
  std::operator+(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  anon_unknown.dwarf_13b32::testTiledImages(in_stack_ffffffffffffffb0);
  std::__cxx11::string::~string(local_58);
  anon_unknown.dwarf_13b32::testSetSampleCounts();
  anon_unknown.dwarf_13b32::testShiftPixels();
  std::operator+(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  anon_unknown.dwarf_13b32::testCropping(in_stack_00000300);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff88);
  anon_unknown.dwarf_13b32::testRenameChannel();
  anon_unknown.dwarf_13b32::testRenameChannels();
  poVar1 = std::operator<<((ostream *)&std::cout,"ok\n");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void
testDeepImage (const string& tempDir)
{
    try
    {
        cout << "Testing class DeepImage" << endl;

        testScanLineImages (tempDir + "deepScanLines.exr");
        testTiledImages (tempDir + "deepTiles.exr");
        testSetSampleCounts ();
        testShiftPixels ();
        testCropping (tempDir + "deepCropped.exr");
        testRenameChannel ();
        testRenameChannels ();

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}